

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrefcnt.cpp
# Opt level: O2

CVmWeakRef * __thiscall CVmWeakRefable::get_weak_ref(CVmWeakRefable *this)

{
  OS_Counter *pOVar1;
  OS_Mutex *pOVar2;
  CVmWeakRef *pCVar3;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mu->h);
  if (this->weakref == (CVmWeakRef *)0x0) {
    pCVar3 = (CVmWeakRef *)operator_new(0x20);
    (pCVar3->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
    (pCVar3->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__CVmWeakRef_0031f5b8;
    pCVar3->ref_ = this;
    pOVar2 = this->mu;
    pCVar3->mu = pOVar2;
    LOCK();
    pOVar1 = &(pOVar2->super_CVmRefCntObj).cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + 1;
    UNLOCK();
    this->weakref = pCVar3;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mu->h);
  LOCK();
  pOVar1 = &(this->weakref->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + 1;
  UNLOCK();
  return this->weakref;
}

Assistant:

CVmWeakRef *CVmWeakRefable::get_weak_ref()
{
    /* lock out other updaters */
    mu->lock();
    
    /* if we don't already have a weak reference object, create one */
    if (weakref == 0)
        weakref = new CVmWeakRef(this);

    /* done with the lock */
    mu->unlock();
    
    /* add a reference on behalf of our caller */
    weakref->add_ref();

    /* return the weak reference object */
    return weakref;
}